

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLDHPublicKey.cpp
# Opt level: O0

void __thiscall OSSLDHPublicKey::~OSSLDHPublicKey(OSSLDHPublicKey *this)

{
  DHPublicKey *in_RDI;
  
  (in_RDI->super_PublicKey).super_Serialisable._vptr_Serialisable =
       (_func_int **)&PTR_serialise_0017b718;
  DH_free((DH *)in_RDI[1].super_PublicKey.super_Serialisable._vptr_Serialisable);
  DHPublicKey::~DHPublicKey(in_RDI);
  return;
}

Assistant:

OSSLDHPublicKey::~OSSLDHPublicKey()
{
	DH_free(dh);
}